

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_decoder.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::IsInitialized(MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  
  if ((((this->predictor_).
        super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
        .pos_attribute_ != (PointAttribute *)0x0) &&
      ((this->predictor_).
       super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
       .entry_to_point_id_map_ != (PointIndex *)0x0)) &&
     (auVar2._0_4_ = -(uint)(*(int *)((long)&(this->
                                             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                                             ).mesh_data_.mesh_ + 4) == 0 &&
                            *(int *)&(this->
                                     super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                                     ).mesh_data_.mesh_ == 0),
     auVar2._4_4_ = -(uint)(*(int *)&(this->
                                     super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                                     ).mesh_data_.corner_table_ == 0 &&
                           *(int *)((long)&(this->
                                           super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                                           ).mesh_data_.corner_table_ + 4) == 0),
     auVar2._8_4_ = -(uint)(*(int *)((long)&(this->
                                            super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                                            ).mesh_data_.vertex_to_data_map_ + 4) == 0 &&
                           *(int *)&(this->
                                    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                                    ).mesh_data_.vertex_to_data_map_ == 0),
     auVar2._12_4_ =
          -(uint)(*(int *)&(this->
                           super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                           ).mesh_data_.data_to_corner_map_ == 0 &&
                 *(int *)((long)&(this->
                                 super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                                 ).mesh_data_.data_to_corner_map_ + 4) == 0),
     iVar1 = movmskps(0,auVar2), iVar1 == 0)) {
    return (this->octahedron_tool_box_).quantization_bits_ != -1;
  }
  return false;
}

Assistant:

bool IsInitialized() const override {
    if (!predictor_.IsInitialized()) {
      return false;
    }
    if (!this->mesh_data().IsInitialized()) {
      return false;
    }
    if (!octahedron_tool_box_.IsInitialized()) {
      return false;
    }
    return true;
  }